

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-reincarnate.c
# Opt level: O2

void reincarnate_borg(void)

{
  int16_t *piVar1;
  ushort uVar2;
  uint uVar3;
  chunk_conflict2 *pcVar4;
  loc_conflict lVar5;
  equip_slot *peVar6;
  start_item *psVar7;
  player_upkeep *ppVar8;
  player_body *ppVar9;
  uint16_t uVar10;
  undefined6 uVar11;
  chunk_conflict *pcVar12;
  player *ppVar13;
  player_body *ppVar14;
  int *piVar15;
  _Bool _Var16;
  guid gVar17;
  uint32_t uVar18;
  wchar_t wVar19;
  player_race *ppVar20;
  player_class *c;
  char *pcVar21;
  equip_slot *peVar22;
  obj_property *poVar23;
  object_kind *kind;
  uint *puVar24;
  object *obj;
  object *poVar25;
  byte bVar26;
  int iVar27;
  undefined1 *puVar28;
  player *ppVar29;
  ulong uVar30;
  start_item **ppsVar31;
  uint8_t uVar32;
  long lVar33;
  long lVar34;
  char buf [80];
  command fake_cmd;
  
  ppVar13 = player;
  pcVar12 = cave;
  pcVar4 = player->cave;
  lVar5 = player->grid;
  cave = (chunk_conflict *)0x0;
  player->cave = (chunk_conflict2 *)0x0;
  piVar15 = borg.trait;
  borg.trait[0x6a] = 0;
  piVar15[0x24] = 1;
  borg_parse((char *)0x0);
  borg_clear_reactions();
  borg_flush();
  player_init(player);
  piVar15 = borg.trait;
  borg.trait[0x7b] = 0;
  piVar15[0x78] = 0;
  piVar15[0x76] = 0;
  piVar15[0x74] = 0;
  piVar15[0x75] = 0;
  borg.time_this_panel = 1;
  unique_on_level = 0;
  vault_on_level = false;
  scaryguy_on_level = false;
  borg.goal.leaving = false;
  borg.goal.fleeing = false;
  breeder_level = false;
  borg.goal.fleeing_to_town = false;
  borg.goal.ignoring = false;
  flavor_init();
  gVar17 = borg_cfg[0x15];
  if (gVar17 == 0xffffffff) {
    gVar17 = Rand_div(0xb);
  }
  ppVar20 = player_id2race(gVar17);
  gVar17 = borg_cfg[0x14];
  if (gVar17 == 0xffffffff) {
    gVar17 = Rand_div(9);
  }
  c = player_id2class(gVar17);
  lVar33 = 0;
  player_generate(player,ppVar20,c,false);
  character_dungeon = false;
  character_generated = false;
  player->depth = 0;
  seed_flavor = Rand_div(0x10000000);
  ppVar14 = bodies;
  ppVar20 = ppVar13->race;
  wVar19 = ppVar20->body;
  pcVar21 = bodies[wVar19].name;
  ppVar9 = bodies + wVar19;
  uVar10 = ppVar9->count;
  uVar11 = *(undefined6 *)&ppVar9->field_0x12;
  peVar22 = *(equip_slot **)(&ppVar9->count + 4);
  (ppVar13->body).next = bodies[wVar19].next;
  (ppVar13->body).name = pcVar21;
  (ppVar13->body).count = uVar10;
  *(undefined6 *)&(ppVar13->body).field_0x12 = uVar11;
  (ppVar13->body).slots = peVar22;
  my_strcpy(buf,ppVar14[ppVar20->body].name,0x50);
  pcVar21 = string_make(buf);
  (ppVar13->body).name = pcVar21;
  peVar22 = (equip_slot *)mem_zalloc((ulong)(ppVar13->body).count << 5);
  (ppVar13->body).slots = peVar22;
  for (uVar30 = 0; uVar30 < (ppVar13->body).count; uVar30 = uVar30 + 1) {
    peVar6 = bodies[ppVar13->race->body].slots;
    *(undefined2 *)((long)&peVar22->type + lVar33) = *(undefined2 *)((long)&peVar6->type + lVar33);
    my_strcpy(buf,*(char **)((long)&peVar6->name + lVar33),0x50);
    pcVar21 = string_make(buf);
    peVar22 = (ppVar13->body).slots;
    *(char **)((long)&peVar22->name + lVar33) = pcVar21;
    lVar33 = lVar33 + 0x20;
  }
  pcVar21 = player->full_name;
  switch(player->race->ridx) {
  case 0:
  case 8:
    uVar18 = Rand_div(0x41);
    my_strcpy(pcVar21,human_syllable1_rel + *(int *)(human_syllable1_rel + (long)(int)uVar18 * 4),
              0x20);
    uVar18 = Rand_div(0x22);
    my_strcat(pcVar21,human_syllable2_rel + *(int *)(human_syllable2_rel + (long)(int)uVar18 * 4),
              0x20);
    uVar18 = Rand_div(0x46);
    lVar33 = (long)(int)uVar18;
    puVar28 = human_syllable3_rel;
    break;
  case 1:
  case 2:
  case 9:
    uVar18 = Rand_div(0x22);
    my_strcpy(pcVar21,elf_syllable1_rel + *(int *)(elf_syllable1_rel + (long)(int)uVar18 * 4),0x20);
    uVar18 = Rand_div(0x11);
    my_strcat(pcVar21,elf_syllable2_rel + *(int *)(elf_syllable2_rel + (long)(int)uVar18 * 4),0x20);
    uVar18 = Rand_div(0x1a);
    lVar33 = (long)(int)uVar18;
    puVar28 = elf_syllable3_rel;
    break;
  case 3:
    uVar18 = Rand_div(0x16);
    my_strcpy(pcVar21,hobbit_syllable1_rel + *(int *)(hobbit_syllable1_rel + (long)(int)uVar18 * 4),
              0x20);
    uVar18 = Rand_div(7);
    my_strcat(pcVar21,hobbit_syllable2_rel + *(int *)(hobbit_syllable2_rel + (long)(int)uVar18 * 4),
              0x20);
    uVar18 = Rand_div(0x19);
    lVar33 = (long)(int)uVar18;
    puVar28 = hobbit_syllable3_rel;
    break;
  case 4:
    uVar18 = Rand_div(0x21);
    my_strcpy(pcVar21,gnome_syllable1_rel + *(int *)(gnome_syllable1_rel + (long)(int)uVar18 * 4),
              0x20);
    uVar18 = Rand_div(10);
    my_strcat(pcVar21,gnome_syllable2_rel + *(int *)(gnome_syllable2_rel + (long)(int)uVar18 * 4),
              0x20);
    uVar18 = Rand_div(0x20);
    lVar33 = (long)(int)uVar18;
    puVar28 = gnome_syllable3_rel;
    break;
  case 5:
    uVar18 = Rand_div(0xf);
    my_strcpy(pcVar21,dwarf_syllable1_rel + *(int *)(dwarf_syllable1_rel + (long)(int)uVar18 * 4),
              0x20);
    uVar18 = Rand_div(6);
    my_strcat(pcVar21,dwarf_syllable2_rel + *(int *)(dwarf_syllable2_rel + (long)(int)uVar18 * 4),
              0x20);
    uVar18 = Rand_div(0x10);
    lVar33 = (long)(int)uVar18;
    puVar28 = dwarf_syllable3_rel;
    break;
  case 6:
  case 7:
  case 10:
    uVar18 = Rand_div(0xe);
    my_strcpy(pcVar21,orc_syllable1_rel + *(int *)(orc_syllable1_rel + (long)(int)uVar18 * 4),0x20);
    uVar18 = Rand_div(6);
    my_strcat(pcVar21,orc_syllable2_rel + *(int *)(orc_syllable2_rel + (long)(int)uVar18 * 4),0x20);
    uVar18 = Rand_div(0x18);
    lVar33 = (long)(int)uVar18;
    puVar28 = orc_syllable3_rel;
    break;
  default:
    *pcVar21 = '\0';
    goto LAB_0022c339;
  }
  my_strcat(pcVar21,puVar28 + *(int *)(puVar28 + lVar33 * 4),0x20);
LAB_0022c339:
  ppVar29 = player;
  uVar2 = z_info->start_gold;
  player->au_birth = (uint)uVar2;
  ppVar29->au = (uint)uVar2;
  iVar27 = (uint)ppVar29->hitdie * 0x32 + -0x32;
  lVar33 = 1;
  lVar34 = lVar33;
  do {
    for (; lVar34 != 0x32; lVar34 = lVar34 + 1) {
      uVar18 = Rand_div((uint)ppVar29->hitdie);
      ppVar29 = player;
      player->player_hp[lVar34] = (short)uVar18 + player->player_hp[lVar34 + -1] + 1;
    }
    lVar34 = lVar33;
  } while (((int)ppVar29->player_hp[0x31] < (iVar27 * 3) / 8 + 0x32) ||
          ((iVar27 * 5) / 8 + 0x32 < (int)ppVar29->player_hp[0x31]));
  poVar25 = ppVar29->obj_k;
  poVar25->to_a = 1;
  poVar25->to_h = 1;
  poVar25->to_d = 1;
  player_learn_innate(ppVar29);
  player_spells_init(player);
  ppVar29 = player;
  player->upkeep->total_weight = L'\0';
  poVar25 = ppVar29->obj_k;
  poVar25->dd = '\x01';
  poVar25->ds = '\x01';
  poVar25->ac = 1;
  for (iVar27 = 1; iVar27 != 0x27; iVar27 = iVar27 + 1) {
    poVar23 = lookup_obj_property(3,iVar27);
    wVar19 = poVar23->subtype;
    if (wVar19 == L'\x04') {
      flag_on_dbg(ppVar29->obj_k->flags,5,iVar27,"p->obj_k->flags","i");
      wVar19 = poVar23->subtype;
    }
    if (wVar19 == L'\a') {
      flag_on_dbg(ppVar29->obj_k->flags,5,iVar27,"p->obj_k->flags","i");
      wVar19 = poVar23->subtype;
    }
    if (wVar19 == L'\b') {
      flag_on_dbg(ppVar29->obj_k->flags,5,iVar27,"p->obj_k->flags","i");
    }
  }
  ppsVar31 = &ppVar29->class->start_items;
  do {
    psVar7 = *ppsVar31;
    if (psVar7 == (start_item *)0x0) {
      if (ppVar29->au < 0) {
        ppVar29->au = 0;
      }
      wield_all(ppVar29);
      update_player_object_knowledge(ppVar29);
      ppVar8 = player->upkeep;
      ppVar8->generate_level = true;
      ppVar8->playing = true;
      my_strcpy(fake_cmd.arg[0].name,"choice",0x14);
      fake_cmd.arg[0].data.choice = 1;
      do_cmd_reset_stats(&fake_cmd);
      store_reset();
      chunk_list_max = 0;
      cleanup_parser(&randart_parser);
      deactivate_randart_file();
      run_parser(&artifact_parser);
      if ((player->opts).opt[0x1e] == true) {
        seed_randart = Rand_div(0x10000000);
        do_randart(seed_randart,true);
        deactivate_randart_file();
      }
      Term_fresh();
      borg_prepare_race_class_info();
      borg_notice_player();
      borg_note("# Respawning");
      ppVar29 = player;
      borg_respawning = 5;
      piVar1 = &player->msp;
      player->chp = player->mhp;
      ppVar29->csp = *piVar1;
      ppVar29->upkeep->energy_use = L'd';
      ppVar8 = ppVar13->upkeep;
      ppVar8->notice = 0;
      ppVar8->update = 0;
      ppVar8->redraw = 0;
      cave = pcVar12;
      ppVar29->cave = pcVar4;
      ppVar29->grid = lVar5;
      character_generated = true;
      if ((ppVar29->noscore & 0x20) == 0) {
        ppVar29->noscore = ppVar29->noscore | 0x20;
      }
      return;
    }
    iVar27 = rand_range(psVar7->min,psVar7->max);
    kind = lookup_kind(psVar7->tval,psVar7->sval);
    if (kind == (object_kind *)0x0) {
      __assert_fail("kind",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/borg/borg-reincarnate.c"
                    ,0x139,"void borg_outfit_player(struct player *)");
    }
    uVar32 = (uint8_t)iVar27;
    if ((((ppVar29->opts).opt[0x27] != false) ||
        (_Var16 = tval_is_food_k(kind), uVar32 = '\x01', _Var16)) ||
       (_Var16 = tval_is_light_k(kind), _Var16)) {
      puVar24 = (uint *)psVar7->eopts;
      if (puVar24 != (uint *)0x0) {
        bVar26 = 1;
        while( true ) {
          uVar3 = *puVar24;
          if (((ulong)uVar3 == 0) || ((bVar26 & 1) == 0)) break;
          if ((int)uVar3 < 1) {
            bVar26 = (ppVar29->opts).opt[-uVar3];
          }
          else {
            bVar26 = (ppVar29->opts).opt[uVar3] ^ 1;
          }
          puVar24 = puVar24 + 1;
        }
        if ((bVar26 & 1) == 0) goto LAB_0022c5e1;
      }
      obj = object_new();
      object_prep(obj,kind,L'\0',MINIMISE);
      obj->number = uVar32;
      obj->origin = '\x12';
      poVar25 = object_new();
      obj->known = poVar25;
      object_set_base_known(ppVar29,obj);
      object_flavor_aware(ppVar29,obj);
      poVar25 = obj->known;
      poVar25->pval = obj->pval;
      poVar25->effect = obj->effect;
      poVar25->notice = poVar25->notice | 2;
      wVar19 = object_value_real(obj,(uint)obj->number);
      ppVar29->au = ppVar29->au - wVar19;
      inven_carry(ppVar29,obj,true,false);
      kind->everseen = true;
    }
LAB_0022c5e1:
    ppsVar31 = &psVar7->next;
  } while( true );
}

Assistant:

void reincarnate_borg(void)
{
    char           buf[80];
    int            i;
    struct player *p = player;

    /* save the existing dungeon.  It is cleared later but needs to */
    /* be blank when  creating the new player */
    struct chunk* sv_cave = cave;
    struct chunk* sv_player_cave = player->cave;
    struct loc sv_grid = player->grid;

    cave = NULL;
    player->cave = NULL;

    /* Cheat death */
    borg.trait[BI_MAXDEPTH]  = 0;
    borg.trait[BI_MAXCLEVEL] = 1;

    /* Flush message buffer */
    borg_parse(NULL);
    borg_clear_reactions();

    /* flush the commands */
    borg_flush();

    /*** Wipe the player ***/
    player_init(player);

    borg.trait[BI_ISCUT] = borg.trait[BI_ISSTUN] = borg.trait[BI_ISHEAVYSTUN]
        = borg.trait[BI_ISIMAGE] = borg.trait[BI_ISSTUDY] = false;

    /* reset our panel clock */
    borg.time_this_panel = 1;

    /* reset our vault/unique check */
    vault_on_level    = false;
    unique_on_level   = 0;
    scaryguy_on_level = false;

    /* reset our breeder flag */
    breeder_level = false;

    /* Assume not leaving the level */
    borg.goal.leaving = false;

    /* Assume not fleeing the level */
    borg.goal.fleeing = false;

    /* Assume not fleeing the level */
    borg.goal.fleeing_to_town = false;

    /* Assume not ignoring monsters */
    borg.goal.ignoring = false;

    flavor_init();

    /** Roll up a new character **/
    struct player_race  *p_race  = NULL;
    struct player_class *p_class = NULL;
    if (borg_cfg[BORG_RESPAWN_RACE] != -1)
        p_race = player_id2race(borg_cfg[BORG_RESPAWN_RACE]);
    else
        p_race = player_id2race(randint0(MAX_RACES));
    if (borg_cfg[BORG_RESPAWN_CLASS] != -1)
        p_class = player_id2class(borg_cfg[BORG_RESPAWN_CLASS]);
    else
        p_class = player_id2class(randint0(MAX_CLASSES));
    player_generate(player, p_race, p_class, false);

    /* The dungeon is not ready nor is the player */
    character_dungeon   = false;
    character_generated = false;

    /* Start in town */
    player->depth = 0;

    /* Hack -- seed for flavors */
    seed_flavor = randint0(0x10000000);

    /* Embody */
    memcpy(&p->body, &bodies[p->race->body], sizeof(p->body));
    my_strcpy(buf, bodies[p->race->body].name, sizeof(buf));
    p->body.name  = string_make(buf);
    p->body.slots = mem_zalloc(p->body.count * sizeof(struct equip_slot));
    for (i = 0; i < p->body.count; i++) {
        p->body.slots[i].type = bodies[p->race->body].slots[i].type;
        my_strcpy(buf, bodies[p->race->body].slots[i].name, sizeof(buf));
        p->body.slots[i].name = string_make(buf);
    }

    /* Get a random name */
    create_random_name(
        player->race->ridx, player->full_name, sizeof(player->full_name));

    /* Give the player some money */
    player->au = player->au_birth = z_info->start_gold;

    /* Hack - need some HP */
    borg_roll_hp();

    /* Hack - player knows all combat runes.  Maybe make them not runes? NRM */
    player->obj_k->to_a = 1;
    player->obj_k->to_h = 1;
    player->obj_k->to_d = 1;

    /* Player learns innate runes */
    player_learn_innate(player);

    /* Initialise the spells */
    player_spells_init(player);

    /* outfit the player */
    borg_outfit_player(player);

    /* generate town */
    player->upkeep->generate_level = true;
    player->upkeep->playing        = true;

    struct command fake_cmd;
    /* fake up a command */
    my_strcpy(fake_cmd.arg[0].name, "choice", sizeof(fake_cmd.arg[0].name));
    fake_cmd.arg[0].data.choice = 1;
    do_cmd_reset_stats(&fake_cmd);

    /* Initialise the stores, dungeon */
    store_reset();
    chunk_list_max = 0;

    /* Restore the standard artifacts (randarts may have been loaded) */
    cleanup_parser(&randart_parser);
    deactivate_randart_file();
    run_parser(&artifact_parser);

    /* Now only randomize the artifacts if required */
    if (OPT(player, birth_randarts)) {
        seed_randart = randint0(0x10000000);
        do_randart(seed_randart, true);
        deactivate_randart_file();
    }

    /* Hack -- flush it */
    Term_fresh();

    /*** Hack -- react to race and class ***/

    /* Notice the new race and class */
    borg_prepare_race_class_info();

#if false
    /* need to check all stats */
    for (int tmp_i = 0; tmp_i < STAT_MAX; tmp_i++)
        my_need_stat_check[tmp_i] = true;
#endif

    borg_notice_player();

    /* Message */
    borg_note("# Respawning");
    borg_respawning = 5;

    /* fully healed and rested */
    player->chp = player->mhp;
    player->csp = player->msp;
    player->upkeep->energy_use = 100;

    /* don't notice or update immediately */
    p->upkeep->notice = 0;
    p->upkeep->update = 0;
    p->upkeep->redraw = 0;

    /* restore the cave */
    cave = sv_cave;
    player->cave = sv_player_cave;
    player->grid = sv_grid;

    /* the new player is now ready */
    character_generated = true;

    /* Mark savefile as borg cheater */
    if (!(player->noscore & NOSCORE_BORG))
        player->noscore |= NOSCORE_BORG;

    /* Done.  Play on */
}